

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.hpp
# Opt level: O1

vec3f Transformed::transformedDir(mat4f *mat,vec3f *v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  vec3f vVar6;
  
  fVar2 = v->x;
  fVar4 = v->y;
  fVar1 = v->z;
  fVar5 = mat->data[2][3] * 0.0 +
          mat->data[2][2] * fVar1 + mat->data[2][0] * fVar2 + mat->data[2][1] * fVar4;
  fVar3 = mat->data[0][3] * 0.0 +
          fVar1 * mat->data[0][2] + fVar2 * mat->data[0][0] + mat->data[0][1] * fVar4;
  fVar4 = mat->data[1][3] * 0.0 +
          fVar1 * mat->data[1][2] + fVar2 * mat->data[1][0] + mat->data[1][1] * fVar4;
  fVar2 = fVar5 * fVar5 + fVar3 * fVar3 + fVar4 * fVar4;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar2 = 1.0 / fVar2;
  vVar6.z = fVar2 * fVar5;
  vVar6.y = fVar4 * fVar2;
  vVar6.x = fVar3 * fVar2;
  return vVar6;
}

Assistant:

static vec3f transformedDir(const mat4f& mat, const vec3f& v) {
		return normalized((mat * vec4f(v, 0)).xyz());
	}